

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.h
# Opt level: O0

void __thiscall XTreeNode::~XTreeNode(XTreeNode *this)

{
  XTreeNode *in_RDI;
  
  ~XTreeNode(in_RDI);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

virtual ~XTreeNode() { removeElements(); }